

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O3

void __thiscall
irr::core::array<irr::scene::ISkinnedMesh::SPositionKey>::erase
          (array<irr::scene::ISkinnedMesh::SPositionKey> *this,u32 index,s32 count)

{
  difference_type __d;
  pointer pSVar1;
  size_t __n;
  int iVar2;
  ulong uVar3;
  pointer pSVar4;
  pointer __src;
  
  if (0 < count) {
    pSVar4 = (this->m_data).
             super__Vector_base<irr::scene::ISkinnedMesh::SPositionKey,_std::allocator<irr::scene::ISkinnedMesh::SPositionKey>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar1 = (this->m_data).
             super__Vector_base<irr::scene::ISkinnedMesh::SPositionKey,_std::allocator<irr::scene::ISkinnedMesh::SPositionKey>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar3 = (long)pSVar1 - (long)pSVar4 >> 4;
    if ((index < uVar3) && (iVar2 = (int)uVar3 - index, iVar2 != 0)) {
      if (iVar2 < count) {
        count = iVar2;
      }
      pSVar4 = pSVar4 + index;
      __src = pSVar4 + count;
      __n = (long)pSVar1 - (long)__src;
      pSVar1 = __src;
      if (__n != 0) {
        memmove(pSVar4,__src,__n);
        pSVar1 = (this->m_data).
                 super__Vector_base<irr::scene::ISkinnedMesh::SPositionKey,_std::allocator<irr::scene::ISkinnedMesh::SPositionKey>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      pSVar4 = (pointer)((long)pSVar4 + ((long)pSVar1 - (long)__src));
      if (pSVar1 != pSVar4) {
        (this->m_data).
        super__Vector_base<irr::scene::ISkinnedMesh::SPositionKey,_std::allocator<irr::scene::ISkinnedMesh::SPositionKey>_>
        ._M_impl.super__Vector_impl_data._M_finish = pSVar4;
      }
    }
  }
  return;
}

Assistant:

void erase(u32 index, s32 count)
	{
		if (index >= m_data.size() || count < 1)
			return;
		count = core::min_(count, (s32)m_data.size() - (s32)index);
		auto first = std::next(m_data.begin(), index);
		auto last = std::next(first, count);
		m_data.erase(first, last);
	}